

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::exceptionsThrow(Forth *this)

{
  Cell CVar1;
  uint uVar2;
  ulong uVar3;
  size_type sVar4;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  uint local_20;
  uint dDepth;
  uint rDepth;
  uint returnDepth;
  uint sourceSaveDepth;
  SCell exceptionNumber;
  Forth *this_local;
  
  _sourceSaveDepth = this;
  returnDepth = ForthStack<unsigned_int>::getTop(&this->dStack);
  if (returnDepth == 0) {
    ForthStack<unsigned_int>::pop(&this->dStack);
  }
  else if ((this->exceptionHandler < 5) ||
          (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->catchStack), CVar1 < 5)) {
    if (returnDepth == 0xffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      throwCppExceptionMessage(this,&local_48,returnDepth);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
    throwCppExceptionMessage(this,&local_80,returnDepth);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  else {
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->catchStack),
          this->exceptionHandler < CVar1) {
      ForthStack<unsigned_int>::pop(&this->catchStack);
    }
    uVar2 = ForthStack<unsigned_int>::getTop(&this->catchStack);
    this->exceptionHandler = uVar2;
    ForthStack<unsigned_int>::pop(&this->catchStack);
    rDepth = ForthStack<unsigned_int>::getTop(&this->catchStack);
    ForthStack<unsigned_int>::pop(&this->catchStack);
    uVar3 = (ulong)rDepth;
    sVar4 = std::
            vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
            ::size(&this->savedInput);
    if (uVar3 < sVar4) {
      std::
      vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
      ::resize(&this->savedInput,(ulong)(rDepth + 1));
      RestoreInput(this);
    }
    dDepth = ForthStack<unsigned_int>::getTop(&this->catchStack);
    ForthStack<unsigned_int>::pop(&this->catchStack);
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->returnStack), dDepth < CVar1) {
      ForthStack<unsigned_int>::pop(&this->returnStack);
    }
    local_20 = ForthStack<unsigned_int>::getTop(&this->catchStack);
    ForthStack<unsigned_int>::pop(&this->catchStack);
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->rStack), local_20 < CVar1) {
      ForthStack<unsigned_int>::pop(&this->rStack);
    }
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->rStack), CVar1 < local_20) {
      ForthStack<unsigned_int>::push(&this->rStack,0);
    }
    local_24 = ForthStack<unsigned_int>::getTop(&this->catchStack);
    ForthStack<unsigned_int>::pop(&this->catchStack);
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->dStack), local_24 < CVar1) {
      ForthStack<unsigned_int>::pop(&this->dStack);
    }
    while (CVar1 = ForthStack<unsigned_int>::stackDepth(&this->dStack), CVar1 < local_24) {
      ForthStack<unsigned_int>::push(&this->dStack,0);
    }
    returnStackRestore(this);
    ForthStack<unsigned_int>::push(&this->dStack,returnDepth);
  }
  return;
}

Assistant:

void exceptionsThrow(){
			SCell exceptionNumber = static_cast<SCell>(dStack.getTop()); 
			if (exceptionNumber != 0){
				if (exceptionHandler >= 5 && catchStack.stackDepth() >= 5){
					while (catchStack.stackDepth() > exceptionHandler) catchStack.pop();
					exceptionHandler = catchStack.getTop(); catchStack.pop();
					auto sourceSaveDepth = catchStack.getTop(); catchStack.pop();
					if (sourceSaveDepth < savedInput.size()) {
						savedInput.resize(sourceSaveDepth + 1);
						RestoreInput();
					}
					auto returnDepth = catchStack.getTop(); catchStack.pop();
					while (returnStack.stackDepth() > returnDepth) returnStack.pop();
					auto rDepth = catchStack.getTop(); catchStack.pop();
					while (rStack.stackDepth() > rDepth) rStack.pop();
					while (rStack.stackDepth() < rDepth) rStack.push(0);
					auto dDepth = catchStack.getTop(); catchStack.pop();
					while (dStack.stackDepth() > dDepth) dStack.pop();
					while (dStack.stackDepth() < dDepth) dStack.push(0);

					returnStackRestore();
					dStack.push(exceptionNumber);
				}
				else {
					if (exceptionNumber == -1){
						throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
					}
					throwCppExceptionMessage("",static_cast<Forth::errorCodes>(exceptionNumber));
				}
			}
			else {
				dStack.pop();
			}
		}